

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNGen.cpp
# Opt level: O0

int __thiscall
NaPNGenerator::verify
          (NaPNGenerator *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ulong extraout_RAX;
  NaVector *pNVar4;
  ulong uVar5;
  bool local_19;
  bool local_1;
  
  if (this->pUnit == (NaUnit *)0x0) {
    pcVar3 = NaPetriNode::name(&this->super_NaPetriNode);
    NaPrintLog("Unit is not defined for generator node \'%s\'.\n",pcVar3);
    local_1 = false;
    uVar5 = extraout_RAX;
  }
  else {
    iVar1 = NaPetriConnector::links((NaPetriConnector *)0x14dbc1);
    if (iVar1 < 1) {
      iVar1 = (*(this->pUnit->super_NaLogging)._vptr_NaLogging[10])();
      pNVar4 = NaPetriCnOutput::data(&this->y);
      iVar2 = (*pNVar4->_vptr_NaVector[6])();
      local_1 = iVar1 == iVar2;
      uVar5 = (ulong)CONCAT31((int3)((uint)iVar1 >> 8),local_1);
    }
    else {
      iVar1 = (*(this->pUnit->super_NaLogging)._vptr_NaLogging[10])();
      pNVar4 = NaPetriCnOutput::data(&this->y);
      iVar2 = (*pNVar4->_vptr_NaVector[6])();
      local_19 = false;
      if (iVar1 == iVar2) {
        pNVar4 = NaPetriCnInput::data((NaPetriCnInput *)this);
        iVar1 = (*pNVar4->_vptr_NaVector[6])();
        local_19 = iVar1 == 1;
      }
      uVar5 = 0;
      local_1 = local_19;
    }
  }
  return (int)CONCAT71((int7)(uVar5 >> 8),local_1);
}

Assistant:

bool
NaPNGenerator::verify ()
{
    if(NULL == pUnit){
        NaPrintLog("Unit is not defined for generator node '%s'.\n",
                   name());
        return false;
    }else if(time.links() > 0){
        return pUnit->OutputDim() == y.data().dim()
            && 1 == time.data().dim();
    }else{
        return pUnit->OutputDim() == y.data().dim();
    }
}